

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

int __thiscall glcts::anon_unknown_0::UniformType::abs(UniformType *this,int __x)

{
  GLenum GVar1;
  UniformType *this_local;
  
  GVar1 = this->baseType;
  if (GVar1 == 0x1404) {
    this_local._0_4_ = 0x29a470c;
  }
  else if (GVar1 == 0x1405) {
    this_local._0_4_ = 0x2a7cf82;
  }
  else {
    if ((GVar1 != 0x1406) && (GVar1 != 0x82e6)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x14e,"const char *glcts::(anonymous namespace)::UniformType::abs() const");
    }
    this_local._0_4_ = 0x2ad431b;
  }
  return (int)this_local;
}

Assistant:

const char* abs() const
	{
		switch (baseType)
		{
		case GL_FLOAT:
		case GL_SAMPLER:
			return "0.1";
		case GL_UNSIGNED_INT:
			return "0u";
		case GL_INT:
			return "0";
		default:
			assert(0);
			return "";
		}
	}